

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

_Bool player_confuse_dir(player *p,int *dp,_Bool too)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  
  if (p->timed[4] == 0) {
LAB_001c2533:
    _Var1 = false;
  }
  else {
    iVar3 = *dp;
    if (iVar3 == 5) {
LAB_001c2501:
      uVar2 = Rand_div(8);
      iVar3 = (int)ddd[(int)uVar2];
    }
    else {
      uVar2 = Rand_div(100);
      if ((int)uVar2 < 0x4b) goto LAB_001c2501;
    }
    if (too) {
      msg("You are too confused.");
    }
    else {
      if (*dp == iVar3) goto LAB_001c2533;
      msg("You are confused.");
      *dp = iVar3;
    }
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool player_confuse_dir(struct player *p, int *dp, bool too)
{
	int dir = *dp;

	if (p->timed[TMD_CONFUSED]) {
		if ((dir == 5) || (randint0(100) < 75)) {
			/* Random direction */
			dir = ddd[randint0(8)];
		}

	/* Running attempts always fail */
	if (too) {
		msg("You are too confused.");
		return true;
	}

	if (*dp != dir) {
		msg("You are confused.");
		*dp = dir;
		return true;
	}
	}

	return false;
}